

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void * TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_>::WriteFile
                 (void *t)

{
  ostream *poVar1;
  int64_t iVar2;
  long in_RDI;
  int64_t eq;
  int64_t neqn;
  unique_lock<std::mutex> lock;
  TPZStack<TPZEqnArray<double>_*,_10> local;
  TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontNonSym<double>_> *parfront;
  TPZEqnArray<double> *in_stack_000031c8;
  TPZStackEqnStorage<double> *in_stack_000031d0;
  TPZStack<TPZEqnArray<double>_*,_10> *in_stack_ffffffffffffff18;
  TPZEqnArray<double> *in_stack_ffffffffffffff20;
  TPZStack<TPZEqnArray<double>_*,_10> *in_stack_ffffffffffffff30;
  TPZManVector<TPZEqnArray<double>_*,_10> *in_stack_ffffffffffffff50;
  int local_a0;
  TPZVec<TPZEqnArray<double>_*> local_80 [3];
  long local_10;
  
  local_10 = in_RDI;
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"Entering Decomposition");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::flush();
  do {
    TPZStack<TPZEqnArray<double>_*,_10>::TPZStack(in_stack_ffffffffffffff30);
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_ffffffffffffff20,
               (mutex_type *)in_stack_ffffffffffffff18);
    iVar2 = TPZVec<TPZEqnArray<double>_*>::NElements
                      ((TPZVec<TPZEqnArray<double>_*> *)(local_10 + 0x1fb60));
    if (iVar2 == 0) {
      if (*(int *)(local_10 + 130000) != 1) {
        std::condition_variable::wait((unique_lock *)(local_10 + 0x1fc00));
        goto LAB_01d3c21d;
      }
      poVar1 = std::operator<<((ostream *)&std::cout,"Leaving WHILE");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      local_a0 = 3;
    }
    else {
LAB_01d3c21d:
      TPZStack<TPZEqnArray<double>_*,_10>::operator=
                ((TPZStack<TPZEqnArray<double>_*,_10> *)in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18);
      TPZManVector<TPZEqnArray<double>_*,_10>::Resize(in_stack_ffffffffffffff50,iVar2);
      local_a0 = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_ffffffffffffff20)
    ;
    if (local_a0 == 0) {
      iVar2 = TPZVec<TPZEqnArray<double>_*>::NElements(local_80);
      for (in_stack_ffffffffffffff50 = (TPZManVector<TPZEqnArray<double>_*,_10> *)0x0;
          (long)in_stack_ffffffffffffff50 < iVar2;
          in_stack_ffffffffffffff50 =
               (TPZManVector<TPZEqnArray<double>_*,_10> *)
               ((long)&(in_stack_ffffffffffffff50->super_TPZVec<TPZEqnArray<double>_*>)._vptr_TPZVec
               + 1)) {
        in_stack_ffffffffffffff30 =
             (TPZStack<TPZEqnArray<double>_*,_10> *)
             TPZVec<TPZEqnArray<double>_*>::operator[](local_80,(int64_t)in_stack_ffffffffffffff50);
        TPZStackEqnStorage<double>::AddEqnArray(in_stack_000031d0,in_stack_000031c8);
        in_stack_ffffffffffffff20 =
             (TPZEqnArray<double> *)
             TPZVec<TPZEqnArray<double>_*>::operator[](local_80,(int64_t)in_stack_ffffffffffffff50);
        in_stack_ffffffffffffff18 =
             *(TPZStack<TPZEqnArray<double>_*,_10> **)in_stack_ffffffffffffff20;
        if (in_stack_ffffffffffffff18 != (TPZStack<TPZEqnArray<double>_*,_10> *)0x0) {
          TPZEqnArray<double>::~TPZEqnArray(in_stack_ffffffffffffff20);
          operator_delete(in_stack_ffffffffffffff18,0x3290);
        }
      }
      local_a0 = 0;
    }
    TPZStack<TPZEqnArray<double>_*,_10>::~TPZStack((TPZStack<TPZEqnArray<double>_*,_10> *)0x1d3c347)
    ;
    if (local_a0 != 0) {
      TPZStackEqnStorage<double>::FinishWriting((TPZStackEqnStorage<double> *)(local_10 + 0x20));
      TPZStackEqnStorage<double>::ReOpen((TPZStackEqnStorage<double> *)(local_10 + 0x20));
      *(undefined4 *)(local_10 + 130000) = 0;
      std::operator<<((ostream *)&std::cout,"Terminating write thread\n");
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void * TPZParFrontMatrix<TVar, store, front>::WriteFile(void *t){
	TPZParFrontMatrix<TVar, store, front> *parfront = (TPZParFrontMatrix<TVar, store, front>*) t;    
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Entering WriteFile thread execution";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	cout << endl << "Entering Decomposition" << endl;
	cout.flush();
	while(1){
		TPZStack<TPZEqnArray<TVar> *> local;
        {
            std::unique_lock<std::mutex> lock(parfront->fwritelock);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Acquired writelock";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            if(parfront->fEqnStack.NElements() == 0){
                if(parfront->fFinish == 1) {
#ifdef PZ_LOG
                    if (logger.isDebugEnabled())
                    {
                        std::stringstream sout;
                        sout << "Terminating WriteFile thread execution";
                        LOGPZ_DEBUG(logger,sout.str())
                    }
#endif
                    cout << "Leaving WHILE" << endl;
                    cout.flush();
                    break;
                }
#ifdef PZ_LOG
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Entering cond_wait on fwritecond variable";
                    LOGPZ_DEBUG(logger,sout.str())
                }
#endif
                parfront->fwritecond.wait(lock);
            }
            
            local = parfront->fEqnStack;
            parfront->fEqnStack.Resize(0);
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Copied the equation stack releasing the writelock";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            
        }
		int64_t neqn = local.NElements();

		int64_t eq;
		for(eq=0; eq<neqn; eq++) {
			parfront->fStorage.AddEqnArray(local[eq]);
			delete local[eq];
		}
	}
	parfront->fStorage.FinishWriting();
	parfront->fStorage.ReOpen();
	parfront->fFinish = 0;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Releasing writelock";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << "Falling through on the write thread";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << "Terminating write thread\n";
	return (0);
}